

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# materials.h
# Opt level: O2

BSDF * __thiscall
pbrt::DiffuseMaterial::GetBSDF<pbrt::UniversalTextureEvaluator>
          (undefined8 param_1,ulong param_2,BSDF *__return_storage_ptr__,DiffuseMaterial *this,
          SampledWavelengths *param_5,float *param_6,undefined8 param_7,undefined8 param_8,
          undefined8 param_9,ulong param_10,undefined8 param_11,undefined8 param_12,
          undefined8 param_13,undefined8 param_14,undefined8 param_15,undefined8 param_16)

{
  undefined1 auVar1 [16];
  undefined8 uVar2;
  TextureEvalContext ctx;
  undefined1 auVar5 [48];
  undefined1 auVar3 [64];
  undefined1 auVar9 [56];
  undefined1 auVar6 [64];
  undefined1 auVar7 [64];
  undefined1 auVar8 [64];
  undefined1 auVar12 [56];
  undefined1 auVar10 [64];
  undefined1 auVar11 [64];
  SampledSpectrum SVar13;
  TextureEvalContext ctx_00;
  UniversalTextureEvaluator local_c9;
  undefined1 local_c8 [16];
  BxDFHandle local_b0;
  uintptr_t local_a8;
  uintptr_t local_a0;
  undefined8 local_98;
  undefined8 uStack_90;
  undefined8 uStack_88;
  undefined8 uStack_80;
  SampledSpectrum r;
  SampledSpectrum local_68;
  DiffuseBxDF local_58;
  undefined1 auVar4 [64];
  undefined1 extraout_var [60];
  
  local_a0 = (this->reflectance).
             super_TaggedPointer<pbrt::RGBConstantTexture,_pbrt::RGBReflectanceConstantTexture,_pbrt::SpectrumImageTexture,_pbrt::GPUSpectrumImageTexture,_pbrt::SpectrumMixTexture,_pbrt::SpectrumScaledTexture,_pbrt::SpectrumConstantTexture,_pbrt::SpectrumBilerpTexture,_pbrt::SpectrumCheckerboardTexture,_pbrt::MarbleTexture,_pbrt::SpectrumDotsTexture,_pbrt::SpectrumPtexTexture>
             .bits;
  local_98 = *(undefined8 *)(param_5->lambda).values;
  uStack_90 = *(undefined8 *)((param_5->lambda).values + 2);
  uStack_88 = *(undefined8 *)(param_5->pdf).values;
  uStack_80 = *(undefined8 *)((param_5->pdf).values + 2);
  ctx_00._8_8_ = param_10;
  ctx_00.p.super_Tuple3<pbrt::Point3,_float>._0_8_ = param_9;
  ctx_00.dpdx.super_Tuple3<pbrt::Vector3,_float>._4_8_ = param_11;
  ctx_00.dpdy.super_Tuple3<pbrt::Vector3,_float>._0_8_ = param_12;
  ctx_00._32_8_ = param_13;
  ctx_00._40_8_ = param_14;
  ctx_00._48_8_ = param_15;
  ctx_00._56_8_ = param_16;
  auVar9 = ZEXT856(param_10);
  auVar12 = ZEXT856(param_2);
  SVar13 = UniversalTextureEvaluator::operator()
                     (&local_c9,(SpectrumTextureHandle)&local_a0,ctx_00,*param_5);
  auVar10._0_8_ = SVar13.values.values._8_8_;
  auVar10._8_56_ = auVar12;
  auVar6._0_8_ = SVar13.values.values._0_8_;
  auVar6._8_56_ = auVar9;
  local_58.R.values.values = (array<float,_4>)vmovlhps_avx(auVar6._0_16_,auVar10._0_16_);
  auVar9 = ZEXT856(local_58.R.values.values._8_8_);
  SVar13 = Clamp<int,int>(&local_58.R,0,1);
  auVar11._0_8_ = SVar13.values.values._8_8_;
  auVar11._8_56_ = auVar12;
  auVar7._0_8_ = SVar13.values.values._0_8_;
  auVar7._8_56_ = auVar9;
  r.values.values = (array<float,_4>)vmovlhps_avx(auVar7._0_16_,auVar11._0_16_);
  local_a8 = (this->sigma).
             super_TaggedPointer<pbrt::FloatImageTexture,_pbrt::GPUFloatImageTexture,_pbrt::FloatMixTexture,_pbrt::FloatScaledTexture,_pbrt::FloatConstantTexture,_pbrt::FloatBilerpTexture,_pbrt::FloatCheckerboardTexture,_pbrt::FloatDotsTexture,_pbrt::FBmTexture,_pbrt::FloatPtexTexture,_pbrt::WindyTexture,_pbrt::WrinkledTexture>
             .bits;
  ctx._8_8_ = param_10;
  ctx.p.super_Tuple3<pbrt::Point3,_float>._0_8_ = param_9;
  ctx.dpdx.super_Tuple3<pbrt::Vector3,_float>._4_8_ = param_11;
  ctx.dpdy.super_Tuple3<pbrt::Vector3,_float>._0_8_ = param_12;
  ctx._32_8_ = param_13;
  ctx._40_8_ = param_14;
  ctx._48_8_ = param_15;
  ctx._56_8_ = param_16;
  auVar5 = ctx._16_48_;
  auVar8._0_4_ = UniversalTextureEvaluator::operator()(&local_c9,(FloatTextureHandle)&local_a8,ctx);
  auVar8._4_60_ = extraout_var;
  auVar1 = vminss_avx(SUB6416(ZEXT464(0x42b40000),0),auVar8._0_16_);
  uVar2 = vcmpss_avx512f(auVar8._0_16_,ZEXT816(0),1);
  auVar4._16_48_ = auVar5;
  auVar4._0_16_ = auVar1;
  auVar3._4_60_ = auVar4._4_60_;
  auVar3._0_4_ = (uint)!(bool)((byte)uVar2 & 1) * auVar1._0_4_;
  local_c8 = auVar3._0_16_;
  SampledSpectrum::SampledSpectrum(&local_68,0.0);
  DiffuseBxDF::DiffuseBxDF(&local_58,&r,&local_68,(Float)local_c8._0_4_);
  param_6[8] = local_58.A;
  param_6[9] = local_58.B;
  *(undefined8 *)param_6 = local_58.R.values.values._0_8_;
  *(undefined8 *)(param_6 + 2) = local_58.R.values.values._8_8_;
  *(undefined8 *)(param_6 + 4) = local_58.T.values.values._0_8_;
  *(undefined8 *)(param_6 + 6) = local_58.T.values.values._8_8_;
  local_b0.
  super_TaggedPointer<pbrt::IdealDiffuseBxDF,_pbrt::DiffuseBxDF,_pbrt::CoatedDiffuseBxDF,_pbrt::CoatedConductorBxDF,_pbrt::DielectricInterfaceBxDF,_pbrt::ThinDielectricBxDF,_pbrt::HairBxDF,_pbrt::MeasuredBxDF,_pbrt::ConductorBxDF,_pbrt::BSSRDFAdapter>
  .bits = (TaggedPointer<pbrt::IdealDiffuseBxDF,_pbrt::DiffuseBxDF,_pbrt::CoatedDiffuseBxDF,_pbrt::CoatedConductorBxDF,_pbrt::DielectricInterfaceBxDF,_pbrt::ThinDielectricBxDF,_pbrt::HairBxDF,_pbrt::MeasuredBxDF,_pbrt::ConductorBxDF,_pbrt::BSSRDFAdapter>
           )((ulong)param_6 | 0x2000000000000);
  BSDF::BSDF(__return_storage_ptr__,(Vector3f *)&stack0x00000048,(Normal3f *)&stack0x00000054,
             (Normal3f *)&stack0x00000060,(Vector3f *)&stack0x0000006c,&local_b0,1.0);
  return __return_storage_ptr__;
}

Assistant:

PBRT_CPU_GPU BSDF GetBSDF(TextureEvaluator texEval, MaterialEvalContext ctx,
                              SampledWavelengths &lambda, DiffuseBxDF *bxdf) const {
        // Evaluate textures for _DiffuseMaterial_ and allocate BSDF
        SampledSpectrum r = Clamp(texEval(reflectance, ctx, lambda), 0, 1);
        Float sig = Clamp(texEval(sigma, ctx), 0, 90);
        *bxdf = DiffuseBxDF(r, SampledSpectrum(0), sig);
        return BSDF(ctx.wo, ctx.n, ctx.ns, ctx.dpdus, bxdf);
    }